

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.h
# Opt level: O2

void __thiscall board::Board::Board(Board *this)

{
  allocator<char> local_31;
  string local_30;
  
  (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,DEFAULT_FEN,&local_31);
  parseFen(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Board()
    {
        parseFen(DEFAULT_FEN);
    }